

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalEffects.cpp
# Opt level: O3

void __thiscall wasm::DiscardGlobalEffects::~DiscardGlobalEffects(DiscardGlobalEffects *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Pass_00d722d8;
  pcVar2 = (this->super_Pass).name._M_dataplus._M_p;
  paVar1 = &(this->super_Pass).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

void run(Module* module) override { getPassOptions().funcEffectsMap.reset(); }